

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedStoragesList.hpp
# Opt level: O2

void __thiscall
supermap::
SortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
::SortedStoragesList
          (SortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
           *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  (this->super_Findable<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>)
  ._vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_001f7eb8;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_manager;
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_unsigned_long,_void>
  ::OrderedStorage(&this->
                    super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_unsigned_long,_void>
                   ,(InnerRegisterSupplier *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  (this->super_Findable<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>)
  ._vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_001f81e8;
  (this->
  super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_unsigned_long,_void>
  )._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_001f8210;
  return;
}

Assistant:

SortedStoragesList()
        : OrderedStorage<SortedStorage, IndexT, void>([]() { return std::make_unique<StoragesRegister>(); }) {}